

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linked_list.h
# Opt level: O3

void __thiscall
data_structures::LinkedList<data_structures::SymbolTableElement<int,_int>_>::~LinkedList
          (LinkedList<data_structures::SymbolTableElement<int,_int>_> *this)

{
  ListNode<data_structures::SymbolTableElement<int,_int>_> *pLVar1;
  ListNode<data_structures::SymbolTableElement<int,_int>_> *pLVar2;
  ListNode<data_structures::SymbolTableElement<int,_int>_> *pLVar3;
  ListNode<data_structures::SymbolTableElement<int,_int>_> *temp_node;
  
  this->_vptr_LinkedList = (_func_int **)&PTR__LinkedList_0010cba8;
  pLVar2 = this->_tail;
  pLVar3 = this->_header;
  while (pLVar3 != pLVar2) {
    pLVar1 = pLVar3->_next;
    if (pLVar1 != (ListNode<data_structures::SymbolTableElement<int,_int>_> *)0x0) {
      pLVar3->_next = pLVar1->_next;
      (*pLVar1->_vptr_ListNode[1])(pLVar1);
      pLVar2 = this->_tail;
    }
    if (pLVar1 == pLVar2) {
      this->_tail = pLVar3;
      pLVar2 = pLVar3;
    }
    this->_size = this->_size - 1;
    pLVar3 = this->_header;
  }
  if (pLVar3 != (ListNode<data_structures::SymbolTableElement<int,_int>_> *)0x0) {
    (*pLVar3->_vptr_ListNode[1])(pLVar3);
  }
  this->_header = (ListNode<data_structures::SymbolTableElement<int,_int>_> *)0x0;
  this->_tail = (ListNode<data_structures::SymbolTableElement<int,_int>_> *)0x0;
  this->_size = 0;
  return;
}

Assistant:

inline
    LinkedList<T>::~LinkedList(){
        while (!isEmpty()) {
            deleteFromHeader();
        }
        delete _header;
        _header = 0;
        _tail = 0;
        _size = 0;
    }